

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O0

bool ON_BrepExtrudeHelper_MakeSides
               (ON_Brep *brep,int loop_index,ON_Curve *path_curve,bool bCap,
               ON_SimpleArray<int> *side_face_index)

{
  bool *pbVar1;
  int iVar2;
  ON_BrepLoop *pOVar3;
  int *piVar4;
  ON_BrepTrim *pOVar5;
  ON_BrepEdge *base_edge_00;
  ON_BrepFace *pOVar6;
  ON_BrepFace *side_face;
  ON_BrepTrim *first_face_east_trim;
  ON_BrepTrim *prev_west_trim;
  ON_BrepEdge *base_edge;
  ON_BrepTrim *trim;
  ON_SumSurface *local_88;
  ON_SumSurface *sum_srf;
  int first_face_east_trim_index;
  int prev_face_index;
  int edge_count0;
  int trim_count0;
  int loop_trim_count;
  bool bRev3d [4];
  int eid [4];
  int vid [4];
  int i;
  int ti;
  int lti;
  ON_SimpleArray<int> *side_face_index_local;
  bool bCap_local;
  ON_Curve *path_curve_local;
  int loop_index_local;
  ON_Brep *brep_local;
  
  pOVar3 = ON_ClassArray<ON_BrepLoop>::operator[]
                     ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,loop_index);
  edge_count0 = ON_SimpleArray<int>::Count(&pOVar3->m_ti);
  if (edge_count0 == 0) {
    brep_local._7_1_ = false;
  }
  else {
    prev_face_index = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&brep->m_T);
    first_face_east_trim_index =
         ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&brep->m_E);
    ON_BrepExtrudeHelper_ReserveSpace(brep,edge_count0,(uint)bCap);
    iVar2 = ON_SimpleArray<int>::Count(side_face_index);
    ON_SimpleArray<int>::Reserve(side_face_index,(long)(iVar2 + edge_count0));
    sum_srf._4_4_ = -1;
    sum_srf._0_4_ = -1;
    for (i = 0; i < edge_count0; i = i + 1) {
      local_88 = (ON_SumSurface *)0x0;
      trim._4_4_ = 0xffffffff;
      ON_SimpleArray<int>::Append(side_face_index,(int *)((long)&trim + 4));
      pOVar3 = ON_ClassArray<ON_BrepLoop>::operator[]
                         ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,loop_index);
      piVar4 = ON_SimpleArray<int>::operator[](&pOVar3->m_ti,i);
      iVar2 = *piVar4;
      if ((-1 < iVar2) && (iVar2 < prev_face_index)) {
        for (vid[3] = 0; vid[3] < 4; vid[3] = vid[3] + 1) {
          eid[(long)vid[3] + 2] = -1;
          pbVar1 = bRev3d + (long)vid[3] * 4 + -4;
          pbVar1[0] = true;
          pbVar1[1] = true;
          pbVar1[2] = true;
          pbVar1[3] = true;
        }
        trim_count0._0_1_ = 0;
        trim_count0._1_1_ = 0;
        trim_count0._2_1_ = 0;
        trim_count0._3_1_ = 0;
        pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&brep->m_T,iVar2);
        if ((-1 < pOVar5->m_ei) && (pOVar5->m_ei < first_face_east_trim_index)) {
          base_edge_00 = ON_ClassArray<ON_BrepEdge>::operator[]
                                   ((ON_ClassArray<ON_BrepEdge> *)&brep->m_E,pOVar5->m_ei);
          if (pOVar5->m_type == seam) {
            sum_srf._4_4_ = -1;
            goto LAB_00553fff;
          }
          eid[2] = pOVar5->m_vi[1];
          eid[3] = pOVar5->m_vi[0];
          loop_trim_count = base_edge_00->m_edge_index;
          trim_count0._0_1_ = (pOVar5->m_bRev3d & 1U) - 1 & 1;
          local_88 = ON_BrepExtrudeHelper_MakeSumSrf
                               (path_curve,base_edge_00,(bool)(pOVar5->m_bRev3d & 1));
        }
        if (local_88 != (ON_SumSurface *)0x0) {
          if (-1 < sum_srf._4_4_) {
            pOVar6 = ON_ClassArray<ON_BrepFace>::operator[]
                               ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,sum_srf._4_4_);
            piVar4 = ON_SimpleArray<int>::operator[](&pOVar6->m_li,0);
            pOVar3 = ON_ClassArray<ON_BrepLoop>::operator[]
                               ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,*piVar4);
            piVar4 = ON_SimpleArray<int>::operator[](&pOVar3->m_ti,3);
            pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                               ((ON_ClassArray<ON_BrepTrim> *)&brep->m_T,*piVar4);
            bRev3d = (bool  [4])pOVar5->m_ei;
            trim_count0._1_1_ = (pOVar5->m_bRev3d & 1U) - 1 & 1;
          }
          if ((-1 < (int)sum_srf) &&
             (pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                                 ((ON_ClassArray<ON_BrepTrim> *)&brep->m_T,(int)sum_srf),
             pOVar5->m_vi[0] == eid[2])) {
            pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                               ((ON_ClassArray<ON_BrepTrim> *)&brep->m_T,(int)sum_srf);
            eid[1] = pOVar5->m_ei;
            trim_count0._3_1_ = (pOVar5->m_bRev3d & 1U) - 1 & 1;
          }
          pOVar6 = ON_Brep::NewFace(brep,&local_88->super_ON_Surface,eid + 2,&loop_trim_count,
                                    (bool *)&trim_count0);
          if (pOVar6 != (ON_BrepFace *)0x0) {
            iVar2 = pOVar6->m_face_index;
            piVar4 = ON_SimpleArray<int>::Last(side_face_index);
            *piVar4 = iVar2;
            sum_srf._4_4_ = pOVar6->m_face_index;
            if ((int)sum_srf < 0) {
              piVar4 = ON_SimpleArray<int>::operator[](&pOVar6->m_li,0);
              pOVar3 = ON_ClassArray<ON_BrepLoop>::operator[]
                                 ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,*piVar4);
              piVar4 = ON_SimpleArray<int>::operator[](&pOVar3->m_ti,1);
              sum_srf._0_4_ = *piVar4;
            }
          }
        }
      }
LAB_00553fff:
    }
    brep_local._7_1_ = true;
  }
  return brep_local._7_1_;
}

Assistant:

static
bool ON_BrepExtrudeHelper_MakeSides(
          ON_Brep& brep,
          int loop_index,
          const ON_Curve& path_curve,
          bool bCap,
          ON_SimpleArray<int>& side_face_index
          )
{
  int lti, ti, i, vid[4], eid[4];
  bool bRev3d[4];

  // indices of new faces appended to the side_face_index[] array 
  // (1 face index for each trim, -1 is used for singular trims)

  // count number of new objects so we can grow arrays
  // efficiently and use refs to dynamic array elements.
  const int loop_trim_count = brep.m_L[loop_index].m_ti.Count();
  if ( loop_trim_count == 0 )
    return false;

  // save input trim and edge counts for use below
  const int trim_count0 = brep.m_T.Count();
  const int edge_count0 = brep.m_E.Count();

  ON_BrepExtrudeHelper_ReserveSpace( brep, loop_trim_count, bCap?1:0 );

  side_face_index.Reserve( side_face_index.Count() + loop_trim_count); // index of new face above brep.m_L[loop_index].m_ti[lti]
  int prev_face_index = -1;
  int first_face_east_trim_index = -1;

  for ( lti = 0; lti < loop_trim_count; lti++ )
  {
    ON_SumSurface* sum_srf = 0;
    side_face_index.Append(-1);
    ti = brep.m_L[loop_index].m_ti[lti];
    if ( ti < 0 || ti >= trim_count0 )
      continue;

    for ( i = 0; i < 4; i++ )
    {
      vid[i] = -1;
      eid[i] = -1;
    }
    bRev3d[0] = false;
    bRev3d[1] = false;
    bRev3d[2] = false;
    bRev3d[3] = false;

    // get side surface for new face
    {
      ON_BrepTrim& trim = brep.m_T[ti];
      if ( trim.m_ei >= 0 &&  trim.m_ei < edge_count0 )
      {
        const ON_BrepEdge& base_edge = brep.m_E[trim.m_ei];

        // 5 September, 2003 Dale Lear
        //   do not extrude seams - fixes rectangle slabe bug
        if ( trim.m_type == ON_BrepTrim::seam )
        {
          prev_face_index = -1;
          continue;
        }

        // connect new face to existing topology on trim
        vid[0] = trim.m_vi[1];
        vid[1] = trim.m_vi[0];
        eid[0] = base_edge.m_edge_index;
        bRev3d[0] = (trim.m_bRev3d?false:true);
        sum_srf = ON_BrepExtrudeHelper_MakeSumSrf( path_curve, base_edge, trim.m_bRev3d );
      }
    }
    if ( !sum_srf )
      continue;

    if ( prev_face_index >= 0 )
    {
      const ON_BrepTrim& prev_west_trim = brep.m_T[ brep.m_L[ brep.m_F[prev_face_index].m_li[0]].m_ti[3] ];
      vid[2] = prev_west_trim.m_vi[0];
      eid[1] = prev_west_trim.m_ei;
      bRev3d[1] = (prev_west_trim.m_bRev3d?false:true);
    }
    if ( first_face_east_trim_index >= 0 && brep.m_T[first_face_east_trim_index].m_vi[0] == vid[0] )
    {
      const ON_BrepTrim& first_face_east_trim = brep.m_T[first_face_east_trim_index];
      vid[3] = first_face_east_trim.m_vi[1];
      eid[3] = first_face_east_trim.m_ei;
      bRev3d[3] = (first_face_east_trim.m_bRev3d?false:true);
    }
    const ON_BrepFace* side_face = brep.NewFace(sum_srf,vid,eid,bRev3d);
    if ( side_face )
    {
      *side_face_index.Last() = side_face->m_face_index;
      prev_face_index = side_face->m_face_index;
      if ( first_face_east_trim_index < 0 )
        first_face_east_trim_index = brep.m_L[ side_face->m_li[0] ].m_ti[1];
    }
  }

  return true;
}